

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListS
          (X3DImporter *this,int pAttrIdx,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pValue)

{
  int iVar1;
  pointer pFVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar3;
  char *pcVar4;
  undefined4 extraout_var_02;
  char *pcVar5;
  undefined4 extraout_var_03;
  void *__dest;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string tstr;
  size_t tlen;
  char *tend;
  char *tbeg;
  char *tok_str_end;
  char *tok_str;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t tok_str_len;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pValue_local;
  X3DImporter *pXStack_10;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  tok_str_len = (size_t)pValue;
  pValue_local._4_4_ = pAttrIdx;
  pXStack_10 = this;
  pFVar2 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar1 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (pFVar2,(ulong)pValue_local._4_4_);
  local_28 = strlen((char *)CONCAT44(extraout_var,iVar1));
  if (local_28 == 0) {
    pFVar2 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar1 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar2,(ulong)pValue_local._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(char *)CONCAT44(extraout_var_00,iVar1),&local_49);
    Throw_IncorrectAttrValue(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  pFVar2 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar1 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (pFVar2,(ulong)pValue_local._4_4_);
  tok_str_end = (char *)CONCAT44(extraout_var_01,iVar1);
  pcVar3 = tok_str_end + local_28;
  do {
    std::__cxx11::string::string((string *)local_a8);
    pcVar4 = strstr(tok_str_end,"\"");
    if (pcVar4 == (char *)0x0) {
      pFVar2 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar1 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,(ulong)pValue_local._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,(char *)CONCAT44(extraout_var_02,iVar1),&local_c9);
      Throw_IncorrectAttrValue(this,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    pcVar4 = pcVar4 + 1;
    pcVar5 = strstr(pcVar4,"\"");
    if (pcVar5 == (char *)0x0) {
      pFVar2 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar1 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,(ulong)pValue_local._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,(char *)CONCAT44(extraout_var_03,iVar1),&local_f1);
      Throw_IncorrectAttrValue(this,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    tok_str_end = pcVar5 + 1;
    tstr.field_2._8_8_ = (long)pcVar5 - (long)pcVar4;
    std::__cxx11::string::resize((ulong)local_a8);
    __dest = (void *)std::__cxx11::string::data();
    memcpy(__dest,pcVar4,tstr.field_2._8_8_);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)tok_str_len,(value_type *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
  } while (tok_str_end < pcVar3);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListS(const int pAttrIdx, std::list<std::string>& pValue)
{
	// make copy of attribute value - strings list.
	const size_t tok_str_len = strlen(mReader->getAttributeValue(pAttrIdx));
    if ( 0 == tok_str_len )
    {
        Throw_IncorrectAttrValue( mReader->getAttributeName( pAttrIdx ) );
    }

	// get pointer to begin of value.
    char *tok_str = const_cast<char*>(mReader->getAttributeValue(pAttrIdx));
    char *tok_str_end = tok_str + tok_str_len;
	// string list has following format: attr_name='"s1" "s2" "sn"'.
	do
	{
		char* tbeg;
		char* tend;
		size_t tlen;
		std::string tstr;

		// find begin of string(element of string list): "sn".
		tbeg = strstr(tok_str, "\"");
		if(tbeg == nullptr) Throw_IncorrectAttrValue(mReader->getAttributeName(pAttrIdx));

		tbeg++;// forward pointer from '\"' symbol to next after it.
		tok_str = tbeg;
		// find end of string(element of string list): "sn".
		tend = strstr(tok_str, "\"");
		if(tend == nullptr) Throw_IncorrectAttrValue(mReader->getAttributeName(pAttrIdx));

		tok_str = tend + 1;
		// create storage for new string
		tlen = tend - tbeg;
		tstr.resize(tlen);// reserve enough space and copy data
		memcpy((void*)tstr.data(), tbeg, tlen);// not strcpy because end of copied string from tok_str has no terminator.
		// and store string in output list.
		pValue.push_back(tstr);
	} while(tok_str < tok_str_end);
}